

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_tests.cpp
# Opt level: O0

bool __thiscall HasJSON::operator()(HasJSON *this,UniValue *value)

{
  bool bVar1;
  byte bVar2;
  int in_ESI;
  lazy_ostream *in_RDI;
  long in_FS_OFFSET;
  string json;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  lazy_ostream *in_stack_ffffffffffffff30;
  char *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  unit_test_log_t *in_stack_ffffffffffffff68;
  undefined1 local_78 [16];
  undefined1 local_68 [64];
  undefined8 local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  UniValue::write_abi_cxx11_((UniValue *)&stack0xffffffffffffffd8,in_ESI,(void *)0x0,0);
  do {
    __lhs = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff38,
               (pointer)in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_ffffffffffffff68,(const_string *)in_RDI,(size_t)__lhs,
               (const_string *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(in_stack_ffffffffffffff30,(char (*) [1])in_stack_ffffffffffffff28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffff38,
               (pointer)in_stack_ffffffffffffff30,(unsigned_long)in_stack_ffffffffffffff28);
    in_stack_ffffffffffffff30 = in_RDI;
    in_stack_ffffffffffffff38 = "m_json";
    in_stack_ffffffffffffff28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1e5f71e;
    in_RDI = in_stack_ffffffffffffff30;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_68,local_78,0x24,1,2,&stack0xffffffffffffffd8);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffff28);
    bVar1 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar1);
  bVar2 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
  std::__cxx11::string::~string(in_stack_ffffffffffffff28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar2 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool operator()(const UniValue& value) const
    {
        std::string json{value.write()};
        BOOST_CHECK_EQUAL(json, m_json);
        return json == m_json;
    }